

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

void cfd::capi::ConvertToKeyData
               (string *pubkey,char *fingerprint,char *bip32_path,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  bool bVar1;
  size_t sVar2;
  CfdException *pCVar3;
  allocator local_46a;
  allocator local_469;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_450;
  Descriptor desc;
  KeyData local_2d0;
  KeyData key_data;
  
  core::KeyData::KeyData(&key_data);
  core::Descriptor::Parse
            (&desc,pubkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  core::Descriptor::GetKeyData(&local_2d0,&desc);
  core::KeyData::operator=(&key_data,&local_2d0);
  core::KeyData::~KeyData(&local_2d0);
  core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  bVar1 = core::KeyData::IsValid(&key_data);
  if (!bVar1) {
    core::KeyData::KeyData((KeyData *)&desc,pubkey,-1,false);
    core::KeyData::operator=(&key_data,(KeyData *)&desc);
    core::KeyData::~KeyData((KeyData *)&desc);
  }
  core::KeyData::GetBip32Path_abi_cxx11_((string *)&desc,&key_data,kApostrophe,false);
  if (CONCAT44(desc.root_node_.name_._M_string_length._4_4_,
               (undefined4)desc.root_node_.name_._M_string_length) == 0) {
    std::__cxx11::string::~string((string *)&desc);
  }
  else {
    core::KeyData::GetFingerprint((ByteData *)&local_2d0,&key_data);
    sVar2 = core::ByteData::GetDataSize((ByteData *)&local_2d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d0);
    std::__cxx11::string::~string((string *)&desc);
    if (sVar2 == 4) {
      core::KeyData::ToString_abi_cxx11_((string *)&desc,&key_data,true,kApostrophe,false);
      std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
      emplace_back<std::__cxx11::string>
                ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)key_list,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc);
      std::__cxx11::string::~string((string *)&desc);
      goto LAB_00385294;
    }
  }
  bVar1 = IsEmptyString(fingerprint);
  if (bVar1) {
    desc.root_node_.name_._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    desc.root_node_.name_._M_string_length._0_4_ = 0xd7;
    desc.root_node_.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7db004;
    core::logger::warn<>((CfdSourceLocation *)&desc,"fingerprint is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&desc,"Failed to parameter. fingerprint is null or empty.",
               (allocator *)&local_2d0);
    core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&desc);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = IsEmptyString(bip32_path);
  if (bVar1) {
    desc.root_node_.name_._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    desc.root_node_.name_._M_string_length._0_4_ = 0xdd;
    desc.root_node_.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7db004;
    core::logger::warn<>((CfdSourceLocation *)&desc,"bip32_path is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&desc,"Failed to parameter. bip32_path is null or empty.",
               (allocator *)&local_2d0);
    core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&desc);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Pubkey::Pubkey((Pubkey *)&local_450,pubkey);
  std::__cxx11::string::string((string *)&desc,bip32_path,&local_469);
  std::__cxx11::string::string((string *)&local_2d0,fingerprint,&local_46a);
  core::ByteData::ByteData((ByteData *)&local_468,(string *)&local_2d0);
  std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
  emplace_back<cfd::core::Pubkey,std::__cxx11::string,cfd::core::ByteData>
            ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)key_list,
             (Pubkey *)&local_450,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc,
             (ByteData *)&local_468);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_468);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&desc);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_450);
LAB_00385294:
  core::KeyData::~KeyData(&key_data);
  return;
}

Assistant:

static void ConvertToKeyData(
    const std::string& pubkey, const char* fingerprint, const char* bip32_path,
    std::vector<KeyData>* key_list) {
  KeyData key_data;
  try {
    auto desc = Descriptor::Parse(pubkey);
    key_data = desc.GetKeyData();
  } catch (const CfdException&) {
    // fall through
  }
  if (!key_data.IsValid()) key_data = KeyData(pubkey);

  if (key_data.GetBip32Path().empty() ||
      (key_data.GetFingerprint().GetDataSize() != 4)) {
    if (IsEmptyString(fingerprint)) {
      warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fingerprint is null or empty.");
    }
    if (IsEmptyString(bip32_path)) {
      warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. bip32_path is null or empty.");
    }
    key_list->emplace_back(
        Pubkey(pubkey), std::string(bip32_path), ByteData(fingerprint));
  } else {
    key_list->emplace_back(key_data.ToString());
  }
}